

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMaxDown
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *dispatcher,bool updateOverlaps)

{
  short *psVar1;
  Edge EVar2;
  btOverlappingPairCallback *pbVar3;
  ushort uVar4;
  ulong uVar5;
  undefined6 in_register_00000012;
  Edge *pEVar6;
  Handle *handle1;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  short *psVar11;
  long lVar12;
  long lVar13;
  
  lVar10 = (long)axis;
  pEVar6 = this->m_pEdges[lVar10];
  uVar5 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar4 = pEVar6[uVar5 - 1].m_pos;
  if (pEVar6[uVar5].m_pos < uVar4) {
    uVar9 = 1 << ((byte)axis & 0x1f) & 3;
    pEVar6 = pEVar6 + uVar5;
    uVar8 = 1 << (sbyte)uVar9 & 3;
    psVar11 = (short *)((long)this->m_pHandles->m_maxEdges +
                       lVar10 * 2 + (ulong)((uint)pEVar6->m_handle * 0x50));
    do {
      lVar7 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
              ((ulong)((uint)pEVar6[-1].m_handle * 0x50) - 0x1c);
      lVar13 = 0x42;
      if (((((uVar4 & 1) == 0) && (lVar13 = 0x3c, updateOverlaps)) &&
          (lVar12 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                    ((ulong)((uint)pEVar6->m_handle * 0x50) - 0x1c),
          *(ushort *)(lVar7 + 0x3c + (ulong)(uVar9 * 2)) <=
          *(ushort *)(lVar12 + 0x42 + (ulong)(uVar9 * 2)))) &&
         (((*(ushort *)(lVar12 + 0x3c + (ulong)(uVar9 * 2)) <=
            *(ushort *)(lVar7 + 0x42 + (ulong)(uVar9 * 2)) &&
           (uVar5 = (ulong)(uVar8 * 2),
           *(ushort *)(lVar7 + 0x3c + uVar5) <= *(ushort *)(lVar12 + 0x42 + uVar5))) &&
          (uVar5 = (ulong)(uVar8 * 2),
          *(ushort *)(lVar12 + 0x3c + uVar5) <= *(ushort *)(lVar7 + 0x42 + uVar5))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,lVar12,lVar7,dispatcher);
        pbVar3 = this->m_userPairCallback;
        if (pbVar3 != (btOverlappingPairCallback *)0x0) {
          (*pbVar3->_vptr_btOverlappingPairCallback[3])(pbVar3,lVar12,lVar7,dispatcher);
        }
      }
      psVar1 = (short *)(lVar7 + lVar13 + lVar10 * 2);
      *psVar1 = *psVar1 + 1;
      *psVar11 = *psVar11 + -1;
      EVar2 = *pEVar6;
      *pEVar6 = pEVar6[-1];
      pEVar6[-1] = EVar2;
      uVar4 = pEVar6[-2].m_pos;
      pEVar6 = pEVar6 + -1;
    } while (EVar2.m_pos < uVar4);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;

			if (updateOverlaps  
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				
				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
			


			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}